

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O0

long cm_zlib_inflateMark(z_streamp strm)

{
  internal_state *piVar1;
  int iVar2;
  uint local_30;
  uint local_2c;
  inflate_state *state;
  z_streamp strm_local;
  
  iVar2 = inflateStateCheck(strm);
  if (iVar2 == 0) {
    piVar1 = strm->state;
    if (piVar1->status == 0x3f43) {
      local_2c = *(uint *)&piVar1->field_0x5c;
    }
    else {
      if (piVar1->status == 0x3f4c) {
        local_30 = (int)piVar1[1].dyn_ltree[0xf7] - *(int *)&piVar1->field_0x5c;
      }
      else {
        local_30 = 0;
      }
      local_2c = local_30;
    }
    strm_local = (z_streamp)((long)(int)piVar1[1].dyn_ltree[0xf6] * 0x10000 + (ulong)local_2c);
  }
  else {
    strm_local = (z_streamp)0xffffffffffff0000;
  }
  return (long)strm_local;
}

Assistant:

long ZEXPORT inflateMark(strm)
z_streamp strm;
{
    struct inflate_state FAR *state;

    if (inflateStateCheck(strm))
        return -(1L << 16);
    state = (struct inflate_state FAR *)strm->state;
    return (long)(((unsigned long)((long)state->back)) << 16) +
        (state->mode == COPY ? state->length :
            (state->mode == MATCH ? state->was - state->length : 0));
}